

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.cc
# Opt level: O2

string * gutil::anon_unknown_4::getValue(string *__return_storage_ptr__,string *s)

{
  ulong uVar1;
  string local_30 [32];
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s);
  uVar1 = std::__cxx11::string::find((char)__return_storage_ptr__,0x23);
  if (uVar1 < __return_storage_ptr__->_M_string_length) {
    std::__cxx11::string::substr((ulong)local_30,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_30);
    std::__cxx11::string::~string(local_30);
  }
  trim(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string getValue(const std::string &s)
{
  std::string ret=s;
  size_t pos=ret.find('#');

  if (pos < ret.size())
  {
    ret=ret.substr(0, pos);
  }

  trim(ret);

  return ret;
}